

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O3

int ON_Intersect(ON_Line *line,ON_Arc *arc,double *line_t0,ON_3dPoint *arc_point0,double *line_t1,
                ON_3dPoint *arc_point1)

{
  ON_3dPoint *pOVar1;
  bool bVar2;
  uint uVar3;
  double *pdVar4;
  uint uVar5;
  ON_3dPoint *circle_point0;
  undefined2 *puVar6;
  double *pdVar7;
  long lVar8;
  double dVar9;
  double t [2];
  ON_3dPoint q;
  ON_Interval arc_domain;
  ON_3dPoint p [2];
  ON_Circle c;
  undefined2 local_16a;
  double local_168 [3];
  ON_Line *local_150;
  uint local_144;
  double *local_140;
  ON_3dPoint *local_138;
  ON_3dPoint local_130;
  double *local_118;
  ON_3dPoint *local_110;
  ON_Interval local_108;
  ON_3dPoint local_f8;
  ON_3dPoint local_e0;
  double local_c8 [2];
  ON_Circle local_b8;
  
  local_118 = line_t1;
  local_110 = arc_point1;
  memcpy(&local_b8,arc,0x88);
  local_16a = 0;
  circle_point0 = &local_f8;
  local_150 = line;
  uVar3 = ON_Intersect(line,&local_b8,local_168,circle_point0,local_168 + 1,&local_e0);
  if (0 < (int)uVar3) {
    local_140 = line_t0;
    local_138 = arc_point0;
    local_108 = ON_Arc::DomainRadians(arc);
    puVar6 = &local_16a;
    lVar8 = 0;
    local_144 = uVar3;
    do {
      pdVar7 = (double *)((long)local_c8 + lVar8);
      bVar2 = ON_Circle::ClosestPointTo(&local_b8,circle_point0,pdVar7);
      *(bool *)puVar6 = bVar2;
      if (bVar2) {
        dVar9 = ON_Interval::NormalizedParameterAt(&local_108,*pdVar7);
        if (0.0 <= dVar9) {
          if (1.0 < dVar9) {
            if (1.0000000149011612 < dVar9) goto LAB_004b9af3;
            pdVar4 = ON_Interval::operator[](&local_108,1);
            dVar9 = *pdVar4;
            *pdVar7 = dVar9;
            ON_Circle::PointAt(&local_130,&local_b8,dVar9);
            goto LAB_004b9b1d;
          }
        }
        else {
          if (dVar9 < -1.490116119385e-08) {
LAB_004b9af3:
            bVar2 = false;
          }
          else {
            pdVar4 = ON_Interval::operator[](&local_108,0);
            dVar9 = *pdVar4;
            *pdVar7 = dVar9;
            ON_Circle::PointAt(&local_130,&local_b8,dVar9);
LAB_004b9b1d:
            circle_point0->z = local_130.z;
            circle_point0->x = local_130.x;
            circle_point0->y = local_130.y;
            bVar2 = ON_Line::ClosestPointTo
                              (local_150,circle_point0,(double *)((long)local_168 + lVar8));
          }
          *(bool *)puVar6 = bVar2;
        }
      }
      pOVar1 = local_138;
      pdVar7 = local_140;
      lVar8 = lVar8 + 8;
      puVar6 = (undefined2 *)((long)puVar6 + 1);
      circle_point0 = circle_point0 + 1;
    } while ((ulong)uVar3 << 3 != lVar8);
    uVar5 = 0;
    if ((((byte)local_16a | local_16a._1_1_) & 1) != 0) {
      uVar5 = local_144;
    }
    if (uVar5 == 2) {
      if ((local_16a & 1) == 0) {
        local_168[0] = local_168[1];
        local_f8.x = local_e0.x;
        local_f8.y = local_e0.y;
        local_f8.z = local_e0.z;
        uVar3 = 0;
        uVar5 = 1;
        if ((local_16a & 0x100) == 0) goto LAB_004b9cfa;
      }
      else {
        uVar5 = 1;
        if ((local_16a & 0x100) != 0) {
          if ((local_168[0] != local_168[1]) || (NAN(local_168[0]) || NAN(local_168[1]))) {
            uVar5 = 2;
          }
          else {
            ON_Line::PointAt(&local_130,local_150,local_168[0]);
            local_150 = (ON_Line *)ON_3dPoint::DistanceTo(&local_f8,&local_130);
            dVar9 = ON_3dPoint::DistanceTo(&local_e0,&local_130);
            if (dVar9 < (double)local_150) {
              local_c8[0] = local_c8[1];
              local_168[0] = local_168[1];
              local_f8.x = local_e0.x;
              local_f8.y = local_e0.y;
              local_f8.z = local_e0.z;
            }
          }
        }
      }
    }
    else {
      uVar3 = (uint)(byte)local_16a;
      if (uVar5 != 1) {
        uVar3 = uVar5;
      }
      uVar5 = uVar3;
      if ((int)uVar3 < 1) goto LAB_004b9cfa;
    }
    uVar3 = uVar5;
    if (pdVar7 != (double *)0x0) {
      *pdVar7 = local_168[0];
    }
    pOVar1->z = local_f8.z;
    pOVar1->x = local_f8.x;
    pOVar1->y = local_f8.y;
    if (uVar3 == 2) {
      if (local_118 != (double *)0x0) {
        *local_118 = local_168[1];
      }
      local_110->z = local_e0.z;
      local_110->x = local_e0.x;
      local_110->y = local_e0.y;
      uVar3 = 2;
    }
  }
LAB_004b9cfa:
  ON_Plane::~ON_Plane(&local_b8.plane);
  return uVar3;
}

Assistant:

int ON_Intersect(
      const ON_Line& line, 
      const ON_Arc& arc,
      double* line_t0,
      ON_3dPoint& arc_point0,
      double* line_t1,
      ON_3dPoint& arc_point1
      )
{
  // RH-48633 In V7 and earlier there were cases where 1 was returned and the 
  // returned arc_point0 is the closest point on the arc to the line but not an
  // intersection point
  ON_Circle c = arc;
  ON_3dPoint p[2];
  double t[2], a[2], s;
  bool b[2] = {false,false};
  int i, xcnt = ON_Intersect( line, c, &t[0], p[0], &t[1], p[1] );
 
  if ( xcnt > 0 )
  {
    // make sure points are on the arc;
    ON_Interval arc_domain = arc.DomainRadians();
    for ( i = 0; i < xcnt; i++ )
    {
      b[i] = c.ClosestPointTo(p[i], &a[i]);
      if ( b[i] )
      {
        s = arc_domain.NormalizedParameterAt(a[i]);
        if ( s < 0.0 )
        {
          if ( s >= -ON_SQRT_EPSILON )
          {
            a[i] = arc_domain[0];
            p[i] = c.PointAt(a[i]);
            b[i] = line.ClosestPointTo( p[i], &t[i] );
          }
          else
            b[i] = false;
        }
        else if ( s > 1.0 )
        {
          if ( s <= 1.0+ON_SQRT_EPSILON )
          {
            a[i] = arc_domain[1];
            p[i] = c.PointAt(a[i]);
            b[i] = line.ClosestPointTo( p[i], &t[i] );
          }
          else
            b[i] = false;
        }
      }
    }
    if ( !b[0] && !b[1] )
      xcnt = 0;

    if ( xcnt == 2 )
    {
      if ( !b[1] )
        xcnt = 1;
      if ( !b[0] )
      {
        xcnt = 1;
        b[0] = b[1];
        t[0] = t[1];
        a[0] = a[1];
        p[0] = p[1];
        b[1] = 0;
      }
      if ( xcnt == 2 && t[0] == t[1] )
      {
        xcnt = 1;
        b[1] = 0;
        ON_3dPoint q = line.PointAt(t[0]);
        if ( p[0].DistanceTo(q) > p[1].DistanceTo(q) )
        {
          a[0] = a[1];
          t[0] = t[1];
          p[0] = p[1];
        }
      }
    }
    if  ( xcnt == 1 && !b[0] )
      xcnt = 0;
    if ( xcnt >= 1 )
    {
      if ( line_t0 )
        *line_t0 = t[0];
      arc_point0 = p[0];
    }
    if ( xcnt == 2 )
    {
      if ( line_t1 )
        *line_t1 = t[1];
      arc_point1 = p[1];
    }
  }
  return xcnt;
}